

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rlib::midi::Smf::getFileImage(Smf *this)

{
  bool bVar1;
  size_type sVar2;
  uchar *__last;
  allocator_type *__a;
  const_iterator in_RSI;
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  in_RDI;
  HeaderChunk HVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *i;
  iterator __end1_1;
  iterator __begin1_1;
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range1_1;
  HeaderChunk headerChunk;
  TrackChunk trackChunk;
  Event *event;
  iterator __end2;
  iterator __begin2;
  Events *__range2;
  anon_class_16_2_cffccc38 fEvent;
  size_t position;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  Track *track;
  const_iterator __end1;
  const_iterator __begin1;
  list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *__range1;
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  trackData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe28;
  iterator in_stack_fffffffffffffe30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe38;
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffe40;
  anon_class_16_2_784f48e0 *in_stack_fffffffffffffe60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe68;
  iterator in_stack_fffffffffffffe70;
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  __first;
  _Self local_130;
  _Self local_128;
  anon_class_24_3_4db44c1f *in_stack_fffffffffffffee0;
  array<unsigned_char,_4UL> in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  anon_class_16_2_cffccc38 *in_stack_ffffffffffffff40;
  _Self local_90;
  _Self local_88;
  anon_class_16_2_cffccc38 *local_80;
  undefined8 *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  undefined8 local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  anon_class_16_2_cffccc38 *local_48;
  _Self local_40;
  _Self local_38;
  uchar *local_30;
  undefined2 extraout_var;
  
  __first._M_current._M_current = in_RDI._M_current._M_current;
  std::__cxx11::
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::list((list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x1cd1ce);
  local_30 = in_RSI._M_current + 8;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::begin
                 ((list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *)
                  in_stack_fffffffffffffe28._M_current);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::end
                 ((list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *)
                  in_stack_fffffffffffffe28._M_current);
  while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
    local_48 = (anon_class_16_2_cffccc38 *)
               std::_List_const_iterator<rlib::midi::Smf::Track>::operator*
                         ((_List_const_iterator<rlib::midi::Smf::Track> *)
                          in_stack_fffffffffffffe30._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cd249);
    local_68 = 0;
    local_78 = &local_68;
    local_70 = &local_60;
    local_80 = local_48;
    local_88._M_node =
         (_Base_ptr)
         std::
         multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
         ::begin((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                  *)in_stack_fffffffffffffe28._M_current);
    local_90._M_node =
         (_Base_ptr)
         std::
         multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
         ::end((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                *)in_stack_fffffffffffffe28._M_current);
    while (bVar1 = std::operator!=(&local_88,&local_90), bVar1) {
      std::_Rb_tree_const_iterator<rlib::midi::Smf::Event>::operator*
                ((_Rb_tree_const_iterator<rlib::midi::Smf::Event> *)0x1cd2d7);
      getFileImage::anon_class_16_2_cffccc38::operator()
                (in_stack_ffffffffffffff40,
                 (Event *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38._M_elems));
      std::_Rb_tree_const_iterator<rlib::midi::Smf::Event>::operator++
                ((_Rb_tree_const_iterator<rlib::midi::Smf::Event> *)
                 in_stack_fffffffffffffe30._M_current);
    }
    in_stack_ffffffffffffff40 = local_48;
    getFileImage::anon_class_24_3_4db44c1f::operator()(in_stack_fffffffffffffee0);
    Inner::TrackChunk::TrackChunk((TrackChunk *)&stack0xffffffffffffff38);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_60);
    in_stack_ffffffffffffff3c = (uint32_t)sVar2;
    Inner::changeEndian<unsigned_int>((uint *)0x1cd39a);
    in_stack_fffffffffffffe68 = &local_60;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe28._M_current);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe30._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe28._M_current);
    in_stack_fffffffffffffe70 =
         std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
                   (in_stack_fffffffffffffe70._M_current,
                    (const_iterator)in_RDI._M_current._M_current,(uchar *)in_stack_fffffffffffffe68,
                    (uchar *)in_stack_fffffffffffffe60);
    std::__cxx11::
    list<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40);
    std::_List_const_iterator<rlib::midi::Smf::Track>::operator++(&local_38);
  }
  HVar3 = getFileImage::anon_class_16_2_784f48e0::operator()(in_stack_fffffffffffffe60);
  __a = (allocator_type *)CONCAT26(extraout_var,HVar3._8_6_);
  __last = HVar3._0_8_;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1cd4db);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffe70._M_current,(uchar *)in_stack_fffffffffffffe68,__last,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1cd506);
  local_128._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ::begin((list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_stack_fffffffffffffe28._M_current);
  local_130._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ::end((list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_fffffffffffffe28._M_current);
  while (bVar1 = std::operator!=(&local_128,&local_130), bVar1) {
    std::_List_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator*
              ((_List_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               0x1cd56b);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe28._M_current);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe30._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe28._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe28._M_current);
    std::
    make_move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (in_stack_fffffffffffffe28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe28._M_current);
    std::
    make_move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe30 =
         std::vector<unsigned_char,std::allocator<unsigned_char>>::
         insert<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
                   (in_stack_fffffffffffffe70._M_current,in_RSI,__first,in_RDI);
    std::_List_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator++
              (&local_128);
  }
  std::__cxx11::
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~list((list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)0x1cd6c1);
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__first._M_current._M_current;
}

Assistant:

std::vector<uint8_t> Smf::getFileImage() const
{
	std::list<std::vector<uint8_t>> trackData;

	for (auto& track : tracks) {
		std::vector<uint8_t> v;

		size_t position = 0;		// 現在位置

		auto fEvent = [&](const Event& event) {

			{// DeltaTime
				assert(event.position >= position);
				const size_t deltaTime = event.position - position;		// DeltaTime
				position = event.position;								// 現在位置更新
				std::vector<uint8_t> s = midi::inner::getVariableValue(deltaTime);
				v.insert(v.end(), std::make_move_iterator(s.begin()), std::make_move_iterator(s.end()));
			}

			{
				std::vector<uint8_t> t = event.event->midiMessage();
				v.insert(v.end(), std::make_move_iterator(t.begin()), std::make_move_iterator(t.end()));
			}

		};

		for (auto& event : track.events) {
			fEvent(event);
		}

		// EndOfTrackがなければ付ける
		[&] {
			if (auto i = track.events.rbegin(); i != track.events.rend()) {		// 末尾が EndOfTrack ではないなら
				if (auto meta = std::dynamic_pointer_cast<const midi::EventMeta>(i->event)) {
					if (meta->type == midi::EventMeta::Type::endOfTrack) {
						return;
					}
				}
			}
			Event e(position, std::make_shared<midi::EventMeta>(midi::EventMeta::createEndOfTrack()));
			fEvent(e);
		}();

		{// TrackChunk を先頭に挿入
			Inner::TrackChunk trackChunk;
			trackChunk.dataLength = static_cast<uint32_t>(v.size());
			Inner::changeEndian(trackChunk.dataLength);
			v.insert(v.begin(),
				reinterpret_cast<const uint8_t*>(&trackChunk),
				reinterpret_cast<const uint8_t*>(&trackChunk) + sizeof(trackChunk));
		}

		trackData.emplace_back(std::move(v));
	}

	const Inner::HeaderChunk headerChunk = [&] {
		Inner::HeaderChunk h;
		h.trackCount = static_cast<uint16_t>(trackData.size());
		h.format = h.trackCount > 1 ? 1 : 0;
		h.division = timeBase;
		// エンディアン変更
		Inner::changeEndian(h.dataLength);
		Inner::changeEndian(h.format);
		Inner::changeEndian(h.trackCount);
		Inner::changeEndian(h.division);
		return h;
	}();

	std::vector<uint8_t> result(
		reinterpret_cast<const uint8_t*>(&headerChunk),
		reinterpret_cast<const uint8_t*>(&headerChunk) + sizeof(headerChunk));

	for (auto& i : trackData) {
		result.insert(result.end(), std::make_move_iterator(i.begin()), std::make_move_iterator(i.end()));
	}

	return result;
}